

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O3

void __thiscall wtlgo::bf::ASTLoop::compute(ASTLoop *this,VM *vm)

{
  undefined8 *puVar1;
  long *plVar2;
  body_t *__range1;
  body_t *pbVar3;
  _List_node_base *p_Var4;
  
  puVar1 = (undefined8 *)
           (**(code **)((long)((vm->tape)._M_t.
                               super___uniq_ptr_impl<BasicTape,_std::default_delete<BasicTape>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_BasicTape_*,_std::default_delete<BasicTape>_>.
                               super__Head_base<0UL,_BasicTape_*,_false>._M_head_impl)->
                              _vptr_BasicTape + 0x10))();
  plVar2 = (long *)(**(code **)(*(long *)*puVar1 + 0x20))();
  if (*plVar2 != 0) {
    pbVar3 = &(this->super_ASTBody).body;
    do {
      for (p_Var4 = (pbVar3->
                    super__List_base<std::shared_ptr<const_wtlgo::bf::AST>,_std::allocator<std::shared_ptr<const_wtlgo::bf::AST>_>_>
                    )._M_impl._M_node.super__List_node_base._M_next;
          p_Var4 != (_List_node_base *)pbVar3; p_Var4 = p_Var4->_M_next) {
        (**(code **)((long)(p_Var4[1]._M_next)->_M_next + 0x10))(p_Var4[1]._M_next,vm);
      }
      puVar1 = (undefined8 *)
               (**(code **)((long)((vm->tape)._M_t.
                                   super___uniq_ptr_impl<BasicTape,_std::default_delete<BasicTape>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_BasicTape_*,_std::default_delete<BasicTape>_>
                                   .super__Head_base<0UL,_BasicTape_*,_false>._M_head_impl)->
                                  _vptr_BasicTape + 0x10))();
      plVar2 = (long *)(**(code **)(*(long *)*puVar1 + 0x20))();
    } while (*plVar2 != 0);
  }
  return;
}

Assistant:

void ASTLoop::compute(VM& vm) const {
    while(vm.tape->get()->get()) {
        ASTBody::compute(vm);
    }
}